

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

Wlc_Ntk_t * Smt_PrsBuild(Smt_Prs_t *p)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vFanins;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  char *pcVar8;
  Wlc_Ntk_t *pNtk;
  Abc_Nam_t *pAVar9;
  char *pcVar10;
  byte *pbVar11;
  Wlc_Obj_t *pObj;
  Smt_LineType_t Type;
  Smt_LineType_t Type_00;
  Smt_LineType_t Type_01;
  Smt_LineType_t Type_02;
  Smt_LineType_t Type_03;
  Smt_LineType_t Type_04;
  Smt_LineType_t Type_05;
  Smt_LineType_t Type_06;
  Smt_LineType_t Type_07;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  int iVar13;
  char *pStr;
  
  vFanins = Vec_IntAlloc(100);
  p_00 = &p->vObjs;
  pVVar6 = Vec_WecEntry(p_00,0);
  for (iVar13 = 0; iVar13 < pVVar6->nSize; iVar13 = iVar13 + 1) {
    iVar1 = Vec_IntEntry(pVVar6,iVar13);
    iVar1 = Abc_LitIsCompl(iVar1);
    if (iVar1 != 0) {
      __assert_fail("!Smt_EntryIsName(Fan)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                    ,0x1ec,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
    }
    pVVar7 = Smt_VecEntryNode(p,pVVar6,iVar13);
    iVar1 = Vec_IntEntry(pVVar7,0);
    iVar2 = Abc_LitIsCompl(iVar1);
    if (iVar2 == 0) {
      __assert_fail("Smt_EntryIsName(Fan)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                    ,0x1ef,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
    }
    uVar3 = Abc_Lit2Var(iVar1);
    if (10 < uVar3) {
      pcVar8 = Smt_EntryName(p,iVar1);
      printf("Ignoring directive \"%s\".\n",pcVar8);
    }
  }
  pNtk = Wlc_NtkAlloc(p->pName,1000);
  pAVar9 = Abc_NamStart(1000,0x18);
  pNtk->pManName = pAVar9;
  pNtk->fSmtLib = 1;
  pVVar6 = &pNtk->vValues;
  iVar13 = 0;
  for (iVar1 = 0; iVar2 = (p->vObjs).nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
    pVVar7 = Vec_WecEntry(p_00,iVar1);
    iVar2 = Smt_VecEntryIsType(pVVar7,5,Type);
    if (iVar2 != 0) {
      if (pVVar7->nSize != 4) {
        __assert_fail("Vec_IntSize(vFans) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1f9,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar2 = Smt_VecEntryIsType(pVVar7,5,Type_00);
      if (iVar2 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1fa,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar2 = Vec_IntEntry(pVVar7,1);
      iVar4 = Abc_LitIsCompl(iVar2);
      if (iVar4 == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1fd,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pcVar8 = Smt_EntryName(p,iVar2);
      iVar2 = Vec_IntEntry(pVVar7,2);
      iVar2 = Abc_LitIsCompl(iVar2);
      if (iVar2 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x201,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar2 = Vec_IntEntry(pVVar7,3);
      iVar2 = Abc_LitIsCompl(iVar2);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(pVVar7,3);
        iVar4 = Abc_LitIsCompl(iVar2);
        if (iVar4 != 0) {
          __assert_fail("!Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x20f,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pVVar7 = Smt_EntryNode(p,iVar2);
        if (pVVar7->nSize != 3) {
          __assert_fail("Vec_IntSize(vFans2) == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x211,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pbVar11 = (byte *)Smt_VecEntryName(p,pVVar7,0);
        uVar3 = *pbVar11 - 0x5f;
        if (uVar3 == 0) {
          uVar3 = (uint)pbVar11[1];
        }
        if (uVar3 != 0) {
          __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x212,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar10 = Smt_VecEntryName(p,pVVar7,1);
        iVar2 = strcmp("BitVec",pcVar10);
        if (iVar2 != 0) {
          __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x213,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        iVar2 = Vec_IntEntry(pVVar7,2);
        iVar4 = Abc_LitIsCompl(iVar2);
        if (iVar4 == 0) {
          __assert_fail("Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x215,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar10 = Smt_EntryName(p,iVar2);
        iVar2 = atoi(pcVar10);
      }
      else {
        pcVar10 = Smt_VecEntryName(p,pVVar7,3);
        iVar4 = strcmp("Bool",pcVar10);
        iVar2 = 1;
        if (iVar4 != 0) {
          __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x207,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
      }
      iVar4 = Wlc_ObjAlloc(pNtk,1,0,iVar2 + -1,0);
      iVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar8,(int *)0x0);
      if (iVar4 != iVar5) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x21c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      Vec_IntPush(pVVar6,iVar4);
      Vec_IntPush(pVVar6,iVar13);
      Vec_IntPush(pVVar6,iVar2);
      iVar13 = iVar2 + iVar13;
    }
  }
  for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
    pVVar6 = Vec_WecEntry(p_00,iVar13);
    iVar1 = Smt_VecEntryIsType(pVVar6,4,Type_01);
    if (iVar1 != 0) {
      if (pVVar6->nSize != 5) {
        __assert_fail("Vec_IntSize(vFans) == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x226,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar6,4,Type_02);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x227,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar6,1);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x22a,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pcVar8 = Smt_EntryName(p,iVar1);
      iVar1 = Vec_IntEntry(pVVar6,2);
      iVar1 = Abc_LitIsCompl(iVar1);
      if (iVar1 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x22e,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar6,3);
      iVar1 = Abc_LitIsCompl(iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(pVVar6,3);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 != 0) {
          __assert_fail("!Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x244,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pVVar7 = Smt_VecEntryNode(p,pVVar6,3);
        if (pVVar7->nSize != 3) {
          __assert_fail("Vec_IntSize(vFans2) == 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x246,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pbVar11 = (byte *)Smt_VecEntryName(p,pVVar7,0);
        uVar3 = *pbVar11 - 0x5f;
        if (uVar3 == 0) {
          uVar3 = (uint)pbVar11[1];
        }
        if (uVar3 != 0) {
          __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x247,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar10 = Smt_VecEntryName(p,pVVar7,1);
        iVar1 = strcmp("BitVec",pcVar10);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x248,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        iVar1 = Vec_IntEntry(pVVar7,2);
        iVar2 = Abc_LitIsCompl(iVar1);
        if (iVar2 == 0) {
          __assert_fail("Smt_EntryIsName(Fan)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x24b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar10 = Smt_EntryName(p,iVar1);
        iVar1 = atoi(pcVar10);
        iVar2 = Vec_IntEntry(pVVar6,4);
        iVar1 = Smt_PrsBuildNode(pNtk,p,iVar2,iVar1,pcVar8);
      }
      else {
        pcVar10 = Smt_VecEntryName(p,pVVar6,3);
        iVar1 = strcmp("Bool",pcVar10);
        if (iVar1 != 0) {
          __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                        ,0x234,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
        }
        pcVar10 = Smt_VecEntryName(p,pVVar6,4);
        iVar1 = strcmp("false",pcVar10);
        pStr = "#b0";
        if (iVar1 != 0) {
          iVar1 = strcmp("true",pcVar10);
          pStr = "#b1";
          if (iVar1 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x23b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
        }
        iVar1 = Smt_PrsBuildConstant(pNtk,pStr,1,pcVar8);
      }
      if (iVar1 == 0) goto LAB_002ce2ba;
    }
    iVar2 = (p->vObjs).nSize;
  }
  for (iVar13 = 0; iVar13 < iVar2; iVar13 = iVar13 + 1) {
    pVVar6 = Vec_WecEntry(p_00,iVar13);
    iVar1 = Smt_VecEntryIsType(pVVar6,7,Type_03);
    if (iVar1 != 0) {
      if (pVVar6->nSize != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x25c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Smt_VecEntryIsType(pVVar6,7,Type_04);
      if (iVar1 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x25d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar1 = Vec_IntEntry(pVVar6,1);
      iVar2 = Abc_LitIsCompl(iVar1);
      if (iVar2 != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x260,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      pVVar6 = Smt_EntryNode(p,iVar1);
      iVar1 = Smt_VecEntryIsType(pVVar6,7,Type_05);
      if (iVar1 == 0) {
        iVar1 = 0;
        while (iVar1 < pVVar6->nSize) {
          Vec_IntEntry(pVVar6,iVar1);
          iVar2 = Vec_IntEntry(pVVar6,0);
          iVar4 = Abc_LitIsCompl(iVar2);
          if (iVar4 != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x269,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pVVar7 = Smt_EntryNode(p,iVar2);
          iVar2 = Vec_IntEntry(pVVar7,0);
          iVar4 = Abc_LitIsCompl(iVar2);
          if (iVar4 == 0) {
            __assert_fail("Smt_EntryIsName(Fan3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x26d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar8 = Smt_EntryName(p,iVar2);
          iVar2 = Vec_IntEntry(pVVar7,1);
          iVar4 = Abc_LitIsCompl(iVar2);
          if (iVar4 != 0) {
            __assert_fail("!Smt_EntryIsName(Fan3)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x271,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          iVar2 = Smt_PrsBuildNode(pNtk,p,iVar2,-1,pcVar8);
          iVar1 = iVar1 + 1;
          if (iVar2 == 0) goto LAB_002ce2ba;
        }
      }
    }
    iVar2 = (p->vObjs).nSize;
  }
  vFanins->nSize = 0;
  iVar13 = 7;
  for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
    pVVar6 = Vec_WecEntry(p_00,iVar1);
    iVar2 = Smt_VecEntryIsType(pVVar6,6,Type_06);
    if (iVar2 != 0) {
      if (pVVar6->nSize != 2) {
        __assert_fail("Vec_IntSize(vFans) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x282,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar2 = Smt_VecEntryIsType(pVVar6,6,Type_07);
      if (iVar2 == 0) {
        __assert_fail("Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x283,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      iVar2 = Vec_IntEntry(pVVar6,1);
      iVar4 = Abc_LitIsCompl(iVar2);
      if (iVar4 == 0) {
        pVVar6 = Smt_VecEntryNode(p,pVVar6,1);
        uVar12 = extraout_RDX;
        while (iVar4 = Smt_VecEntryIsType(pVVar6,7,(Smt_LineType_t)uVar12), iVar4 != 0) {
          iVar2 = Vec_IntEntry(pVVar6,2);
          iVar4 = Abc_LitIsCompl(iVar2);
          if (iVar4 != 0) break;
          pVVar6 = Smt_VecEntryNode(p,pVVar6,2);
          uVar12 = extraout_RDX_00;
        }
      }
      iVar2 = Smt_PrsBuildNode(pNtk,p,iVar2,-1,(char *)0x0);
      if (iVar2 == 0) goto LAB_002ce2ba;
      Vec_IntPush(vFanins,iVar2);
    }
    iVar2 = (p->vObjs).nSize;
  }
  if (vFanins->nSize != 1) {
    iVar13 = Smt_PrsCreateNode(pNtk,0x17,0,vFanins->nSize,vFanins,(char *)0x0);
    Vec_IntFill(vFanins,1,iVar13);
    iVar13 = 0x25;
  }
  iVar13 = Smt_PrsCreateNode(pNtk,iVar13,0,1,vFanins,"miter_output");
  pObj = Wlc_NtkObj(pNtk,iVar13);
  Wlc_ObjSetCo(pNtk,pObj,0);
  pVVar6 = Vec_IntStartNatural(pNtk->iObj);
  Vec_IntAppend(&pNtk->vNameIds,pVVar6);
  Vec_IntFree(pVVar6);
LAB_002ce2cc:
  Vec_IntFree(vFanins);
  return pNtk;
LAB_002ce2ba:
  Wlc_NtkFree(pNtk);
  pNtk = (Wlc_Ntk_t *)0x0;
  goto LAB_002ce2cc;
}

Assistant:

Wlc_Ntk_t * Smt_PrsBuild( Smt_Prs_t * p )
{
    Wlc_Ntk_t * pNtk;
    Vec_Int_t * vFans, * vFans2, * vFans3; 
    Vec_Int_t * vAsserts = Vec_IntAlloc(100);
    char * pName, * pRange, * pValue;
    int i, k, Fan, Fan3, iObj, Status, Range, NameId, nBits = 0;
    // issue warnings about unknown dirs
    vFans = Vec_WecEntry( &p->vObjs, 0 );
    Vec_IntForEachEntry( vFans, Fan, i )
    {
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_VecEntryNode( p, vFans, i );
        Fan = Vec_IntEntry(vFans2, 0);
        assert( Smt_EntryIsName(Fan) );
        if ( Abc_Lit2Var(Fan) >= SMT_PRS_END )
            printf( "Ignoring directive \"%s\".\n", Smt_EntryName(p, Fan) );
    }
    // start network and create primary inputs
    pNtk = Wlc_NtkAlloc( p->pName, 1000 );
    pNtk->pManName = Abc_NamStart( 1000, 24 );
    pNtk->fSmtLib = 1;
    Smt_ManForEachDir( p, SMT_PRS_DECLARE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 4 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            //(declare-fun s1 () Bool)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
        }
        else
        {
            // (declare-fun s1 () (_ BitVec 64))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_EntryNode(p, Fan);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
        }
        // create node
        iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, 0, Range-1, 0 );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, NULL );
        assert( iObj == NameId );
        // save values
        Vec_IntPush( &pNtk->vValues, NameId );
        Vec_IntPush( &pNtk->vValues, nBits );
        Vec_IntPush( &pNtk->vValues, Range );
        nBits += Range;
    }
    // create constants
    Smt_ManForEachDir( p, SMT_PRS_DEFINE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 5 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            // (define-fun s_2 () Bool false)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
            pValue = Smt_VecEntryName(p, vFans, 4);
            if ( !strcmp("false", pValue) )
                pValue = "#b0";
            else if ( !strcmp("true", pValue) )
                pValue = "#b1";
            else assert( 0 );
            Status = Smt_PrsBuildConstant( pNtk, pValue, Range, pName );
        }
        else
        {
            // (define-fun s702 () (_ BitVec 4) #xe)
            // (define-fun s1 () (_ BitVec 8) (bvneg #x7f))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_VecEntryNode(p, vFans, 3);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            // get range
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
            // get constant
            Fan = Vec_IntEntry(vFans, 4);
            Status = Smt_PrsBuildNode( pNtk, p, Fan, Range, pName );
        }        
        if ( !Status )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
    }
    // process let-statements
    Smt_ManForEachDir( p, SMT_PRS_LET, vFans, i )
    {
        // let ((s35550 (bvor s48 s35549)))
        assert( Vec_IntSize(vFans) == 3 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET) );
        // get parts
        Fan = Vec_IntEntry(vFans, 1);
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_EntryNode(p, Fan);
        if ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            continue;
        // iterate through the parts
        Vec_IntForEachEntry( vFans2, Fan, k )
        {
            // s35550 (bvor s48 s35549)
            Fan = Vec_IntEntry(vFans2, 0);
            assert( !Smt_EntryIsName(Fan) );
            vFans3 = Smt_EntryNode(p, Fan);
            // get the name
            Fan3 = Vec_IntEntry(vFans3, 0);
            assert( Smt_EntryIsName(Fan3) );
            pName = Smt_EntryName(p, Fan3);
            // get function
            Fan3 = Vec_IntEntry(vFans3, 1);
            assert( !Smt_EntryIsName(Fan3) );
            Status = Smt_PrsBuildNode( pNtk, p, Fan3, -1, pName );
            if ( !Status )
            {
                Wlc_NtkFree( pNtk ); pNtk = NULL;
                goto finish;
            }
        }
    }
    // process assert-statements
    Vec_IntClear( vAsserts );
    Smt_ManForEachDir( p, SMT_PRS_ASSERT, vFans, i )
    {
        //(assert ; no quantifiers
        //   (let ((s2 (bvsge s0 s1)))
        //   (not s2)))
        //(assert (not (= s0 #x00)))
        assert( Vec_IntSize(vFans) == 2 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT) );
        // get second directive
        Fan = Vec_IntEntry(vFans, 1);
        if ( !Smt_EntryIsName(Fan) )
        {
            // find the final let-statement
            vFans2 = Smt_VecEntryNode(p, vFans, 1);
            while ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            {
                Fan = Vec_IntEntry(vFans2, 2);
                if ( Smt_EntryIsName(Fan) )
                    break;
                vFans2 = Smt_VecEntryNode(p, vFans2, 2);
            }
        }
        // find name or create node
        iObj = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
        if ( !iObj )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
        Vec_IntPush( vAsserts, iObj );
    }
    // build AND of asserts
    if ( Vec_IntSize(vAsserts) == 1 )
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BUF, 0, 1, vAsserts, "miter_output" );
    else
    {
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vAsserts), vAsserts, NULL );
        Vec_IntFill( vAsserts, 1, iObj );
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_REDUCT_AND, 0, 1, vAsserts, "miter_output" );
    }
    Wlc_ObjSetCo( pNtk, Wlc_NtkObj(pNtk, iObj), 0 );
    // create nameIDs
    vFans = Vec_IntStartNatural( Wlc_NtkObjNumMax(pNtk) );
    Vec_IntAppend( &pNtk->vNameIds, vFans );
    Vec_IntFree( vFans );
    //Wlc_NtkReport( pNtk, NULL );
finish:
    // cleanup
    Vec_IntFree(vAsserts);
    return pNtk;
}